

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemExpandBlob(Mem *pMem)

{
  int iVar1;
  int local_1c;
  int nByte;
  Mem *pMem_local;
  
  if ((pMem->flags & 0x4000) != 0) {
    local_1c = pMem->n + (pMem->u).nZero;
    if (local_1c < 1) {
      local_1c = 1;
    }
    iVar1 = sqlite3VdbeMemGrow(pMem,local_1c,1);
    if (iVar1 != 0) {
      return 7;
    }
    memset(pMem->z + pMem->n,0,(long)(pMem->u).nZero);
    pMem->n = (pMem->u).nZero + pMem->n;
    pMem->flags = pMem->flags & 0xbdff;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemExpandBlob(Mem *pMem){
  if( pMem->flags & MEM_Zero ){
    int nByte;
    assert( pMem->flags&MEM_Blob );
    assert( (pMem->flags&MEM_RowSet)==0 );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );

    /* Set nByte to the number of bytes required to store the expanded blob. */
    nByte = pMem->n + pMem->u.nZero;
    if( nByte<=0 ){
      nByte = 1;
    }
    if( sqlite3VdbeMemGrow(pMem, nByte, 1) ){
      return SQLITE_NOMEM;
    }

    memset(&pMem->z[pMem->n], 0, pMem->u.nZero);
    pMem->n += pMem->u.nZero;
    pMem->flags &= ~(MEM_Zero|MEM_Term);
  }
  return SQLITE_OK;
}